

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::Event::disarm(Event *this)

{
  long *in_FS_OFFSET;
  Fault local_18;
  Fault f;
  Event *this_local;
  
  if (this->prev != (Event **)0x0) {
    if ((*(EventLoop **)(*in_FS_OFFSET + -0x20) != this->loop) &&
       (*(long *)(*in_FS_OFFSET + -0x20) != 0)) {
      f.exception = (Exception *)this;
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                (&local_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x8ff,FAILED,(char *)0x0,
                 "\"Promise destroyed from a different thread than it was created in.\"",
                 (char (*) [66])"Promise destroyed from a different thread than it was created in.")
      ;
      Debug::Fault::fatal(&local_18);
    }
    if (this->loop->tail == &this->next) {
      this->loop->tail = this->prev;
    }
    if (this->loop->depthFirstInsertPoint == &this->next) {
      this->loop->depthFirstInsertPoint = this->prev;
    }
    if (this->loop->breadthFirstInsertPoint == &this->next) {
      this->loop->breadthFirstInsertPoint = this->prev;
    }
    if (this->loop->wouldSleepTail == &this->next) {
      this->loop->wouldSleepTail = this->prev;
    }
    *this->prev = this->next;
    if (this->next != (Event *)0x0) {
      this->next->prev = this->prev;
    }
    this->prev = (Event **)0x0;
    this->next = (Event *)0x0;
  }
  return;
}

Assistant:

void Event::disarm() noexcept {
  if (prev != nullptr) {
    if (threadLocalEventLoop != &loop && threadLocalEventLoop != nullptr) {
      // This will crash because the method is `noexcept`. That's good because otherwise we're
      // likely going to segfault later.
      KJ_FAIL_ASSERT("Promise destroyed from a different thread than it was created in.");
    }

    if (loop.tail == &next) {
      loop.tail = prev;
    }
    if (loop.depthFirstInsertPoint == &next) {
      loop.depthFirstInsertPoint = prev;
    }
    if (loop.breadthFirstInsertPoint == &next) {
      loop.breadthFirstInsertPoint = prev;
    }
    if (loop.wouldSleepTail == &next) {
      loop.wouldSleepTail = prev;
    }

    *prev = next;
    if (next != nullptr) {
      next->prev = prev;
    }

    prev = nullptr;
    next = nullptr;
  }
}